

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O2

void __thiscall
ConfidentialValue_ConvertToConfidentialValue_Test::TestBody
          (ConfidentialValue_ConvertToConfidentialValue_Test *this)

{
  char *message;
  AssertHelper AStack_68;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50 [4];
  ByteData bytedata;
  
  cfd::core::Amount::CreateBySatoshiAmount(100000000);
  cfd::core::ConfidentialValue::ConvertToConfidentialValue((Amount *)&bytedata);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"bytedata.GetHex().c_str()","\"010000000005f5e100\"",
             (char *)local_50[0].ptr_,"010000000005f5e100");
  std::__cxx11::string::~string((string *)local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x93,message);
    testing::internal::AssertHelper::operator=(&AStack_68,(Message *)local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bytedata);
  return;
}

Assistant:

TEST(ConfidentialValue, ConvertToConfidentialValue) {
  Amount amount = Amount::CreateBySatoshiAmount(100000000);
  ByteData bytedata = ConfidentialValue::ConvertToConfidentialValue(amount);
  EXPECT_STREQ(bytedata.GetHex().c_str(), "010000000005f5e100");
}